

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeField(ParserImpl *this,Message *message)

{
  long lVar1;
  Finder *pFVar2;
  long lVar3;
  OneofDescriptor *oneof_descriptor;
  bool bVar4;
  _Alloc_hider __n;
  bool bVar5;
  int iVar6;
  CppType CVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ExtensionRange *pEVar8;
  undefined4 extraout_var_02;
  FieldDescriptor *pFVar9;
  Descriptor *pDVar10;
  long *plVar11;
  Descriptor *pDVar12;
  ReservedRange *pRVar13;
  LogMessage *other;
  FieldDescriptor *pFVar14;
  undefined8 *puVar15;
  MessageFactory *factory;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  MessageLite *this_00;
  size_type *psVar17;
  Reflection *extraout_RDX;
  pointer pcVar18;
  size_type *psVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  bool bVar23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  ulong local_158;
  ulong local_150;
  size_type *local_148;
  long local_140;
  FieldDescriptor *local_138;
  FieldDescriptor *any_type_url_field;
  FieldDescriptor *any_value_field;
  undefined1 local_120 [8];
  int32 field_number;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  undefined1 local_100 [8];
  string field_name;
  undefined8 local_d0;
  undefined8 uStack_c8;
  Reflection *local_c0;
  undefined1 local_b8 [8];
  string full_type_name;
  undefined1 local_80 [8];
  string prefix;
  string serialized_value;
  undefined4 extraout_var_03;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x13])(message);
  local_c0 = extraout_RDX;
  iVar6 = (*(message->super_MessageLite)._vptr_MessageLite[0x13])(message);
  pDVar10 = (Descriptor *)CONCAT44(extraout_var,iVar6);
  local_100 = (undefined1  [8])&field_name._M_string_length;
  field_name._M_dataplus._M_p = (pointer)0x0;
  field_name._M_string_length._0_1_ = 0;
  local_150 = (ulong)(uint)(this->tokenizer_).current_.line;
  local_158 = (ulong)(uint)(this->tokenizer_).current_.column;
  serialized_value.field_2._8_8_ = message;
  bVar5 = internal::GetAnyFieldDescriptors(message,&local_138,&any_type_url_field);
  if (bVar5) {
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"[","");
    bVar5 = TryConsume(this,&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
  }
  else {
    bVar5 = false;
  }
  if (bVar5 == false) {
    psVar19 = &full_type_name._M_string_length;
    local_b8 = (undefined1  [8])psVar19;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"[","");
    bVar5 = TryConsume(this,(string *)local_b8);
    if (local_b8 != (undefined1  [8])psVar19) {
      operator_delete((void *)local_b8);
    }
    if (bVar5) {
      bVar5 = ConsumeFullTypeName(this,(string *)local_100);
      if (bVar5) {
        local_b8 = (undefined1  [8])psVar19;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"]","");
        bVar5 = Consume(this,(string *)local_b8);
        if (local_b8 != (undefined1  [8])psVar19) {
          operator_delete((void *)local_b8);
        }
        if (bVar5) {
          pFVar2 = this->finder_;
          if (pFVar2 == (Finder *)0x0) {
            pDVar12 = (Descriptor *)(**(code **)(*(long *)serialized_value.field_2._8_8_ + 0x98))();
            pFVar14 = DescriptorPool::FindExtensionByPrintableName
                                (*(DescriptorPool **)(*(long *)(pDVar12 + 0x10) + 0x10),pDVar12,
                                 (string *)local_100);
          }
          else {
            iVar6 = (*pFVar2->_vptr_Finder[2])(pFVar2,serialized_value.field_2._8_8_,local_100);
            pFVar14 = (FieldDescriptor *)CONCAT44(extraout_var_01,iVar6);
          }
          if (pFVar14 == (FieldDescriptor *)0x0) {
            if ((this->allow_unknown_field_ != false) || (this->allow_unknown_extension_ != false))
            {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&field_name.field_2 + 8),"Ignoring extension \"",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_100);
              plVar11 = (long *)std::__cxx11::string::append(field_name.field_2._M_local_buf + 8);
              psVar17 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar17) {
                serialized_value._M_string_length = *psVar17;
                serialized_value.field_2._M_allocated_capacity = plVar11[3];
                prefix.field_2._8_8_ = &serialized_value._M_string_length;
              }
              else {
                serialized_value._M_string_length = *psVar17;
                prefix.field_2._8_8_ = (size_type *)*plVar11;
              }
              serialized_value._M_dataplus._M_p = (pointer)plVar11[1];
              *plVar11 = (long)psVar17;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&prefix.field_2 + 8),
                             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                              (pDVar10 + 8));
              plVar11 = (long *)std::__cxx11::string::append(local_80);
              psVar17 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar17) {
                full_type_name._M_string_length = *psVar17;
                full_type_name.field_2._M_allocated_capacity = plVar11[3];
                local_b8 = (undefined1  [8])psVar19;
              }
              else {
                full_type_name._M_string_length = *psVar17;
                local_b8 = (undefined1  [8])*plVar11;
              }
              full_type_name._M_dataplus._M_p = (pointer)plVar11[1];
              *plVar11 = (long)psVar17;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column
                            ,(string *)local_b8);
              if (local_b8 != (undefined1  [8])psVar19) {
                operator_delete((void *)local_b8);
              }
              if (local_80 != (undefined1  [8])&prefix._M_string_length) {
                operator_delete((void *)local_80);
              }
              if ((size_type *)prefix.field_2._8_8_ != &serialized_value._M_string_length) {
                operator_delete((void *)prefix.field_2._8_8_);
              }
              if ((undefined8 *)field_name.field_2._8_8_ != &stack0xffffffffffffff30) {
                operator_delete((void *)field_name.field_2._8_8_);
              }
              pFVar14 = (FieldDescriptor *)0x0;
              goto LAB_002fbd61;
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&field_name.field_2 + 8),"Extension \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_100);
            plVar11 = (long *)std::__cxx11::string::append(field_name.field_2._M_local_buf + 8);
            prefix.field_2._8_8_ = &serialized_value._M_string_length;
            psVar17 = (size_type *)(plVar11 + 2);
            if ((size_type *)*plVar11 == psVar17) {
              serialized_value._M_string_length = *psVar17;
              serialized_value.field_2._M_allocated_capacity = plVar11[3];
            }
            else {
              serialized_value._M_string_length = *psVar17;
              prefix.field_2._8_8_ = (size_type *)*plVar11;
            }
            serialized_value._M_dataplus._M_p = (pointer)plVar11[1];
            *plVar11 = (long)psVar17;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&prefix.field_2 + 8),
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            (pDVar10 + 8));
            plVar11 = (long *)std::__cxx11::string::append(local_80);
            psVar17 = (size_type *)(plVar11 + 2);
            if ((size_type *)*plVar11 == psVar17) {
              full_type_name._M_string_length = *psVar17;
              full_type_name.field_2._M_allocated_capacity = plVar11[3];
              local_b8 = (undefined1  [8])psVar19;
            }
            else {
              full_type_name._M_string_length = *psVar17;
              local_b8 = (undefined1  [8])*plVar11;
            }
            full_type_name._M_dataplus._M_p = (pointer)plVar11[1];
            *plVar11 = (long)psVar17;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        (string *)local_b8);
            goto LAB_002fc417;
          }
LAB_002fbd61:
          bVar5 = false;
          goto LAB_002fbfe6;
        }
      }
      goto LAB_002fc9df;
    }
    bVar5 = ConsumeIdentifier(this,(string *)local_100);
    if (!bVar5) goto LAB_002fc9df;
    if ((this->allow_field_number_ == true) &&
       (bVar5 = safe_strto32((string *)local_100,(int32 *)local_120), bVar5)) {
      pEVar8 = Descriptor::FindExtensionRangeContainingNumber(pDVar10,local_120._0_4_);
      if (pEVar8 == (ExtensionRange *)0x0) {
        pRVar13 = Descriptor::FindReservedRangeContainingNumber(pDVar10,local_120._0_4_);
        if (pRVar13 != (ReservedRange *)0x0) {
          bVar5 = true;
LAB_002fbc5b:
          pFVar14 = (FieldDescriptor *)0x0;
          goto LAB_002fbdd5;
        }
        pFVar14 = Descriptor::FindFieldByNumber(pDVar10,local_120._0_4_);
      }
      else {
        pFVar2 = this->finder_;
        if (pFVar2 == (Finder *)0x0) {
          pFVar14 = DescriptorPool::FindExtensionByNumber
                              (*(DescriptorPool **)(*(long *)(pDVar10 + 0x10) + 0x10),pDVar10,
                               local_120._0_4_);
        }
        else {
          iVar6 = (*pFVar2->_vptr_Finder[3])(pFVar2,pDVar10);
          pFVar14 = (FieldDescriptor *)CONCAT44(extraout_var_02,iVar6);
        }
      }
LAB_002fbdd2:
      bVar5 = false;
    }
    else {
      pFVar14 = Descriptor::FindFieldByName(pDVar10,(string *)local_100);
      if (pFVar14 == (FieldDescriptor *)0x0) {
        local_b8 = (undefined1  [8])psVar19;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b8,local_100,field_name._M_dataplus._M_p + (long)local_100);
        if (full_type_name._M_dataplus._M_p != (pointer)0x0) {
          pcVar18 = (pointer)0x0;
          do {
            if ((byte)(*(byte *)((long)local_b8 + (long)pcVar18) + 0xbf) < 0x1a) {
              *(byte *)((long)local_b8 + (long)pcVar18) =
                   *(byte *)((long)local_b8 + (long)pcVar18) | 0x20;
            }
            pcVar18 = pcVar18 + 1;
          } while (full_type_name._M_dataplus._M_p != pcVar18);
        }
        pFVar9 = Descriptor::FindFieldByName(pDVar10,(string *)local_b8);
        if (pFVar9 == (FieldDescriptor *)0x0) {
          pFVar14 = (FieldDescriptor *)0x0;
        }
        else {
          if (*(once_flag **)(pFVar9 + 0x30) != (once_flag *)0x0) {
            local_80 = (undefined1  [8])FieldDescriptor::TypeOnceInit;
            prefix.field_2._8_8_ = pFVar9;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (*(once_flag **)(pFVar9 + 0x30),(_func_void_FieldDescriptor_ptr **)local_80,
                       (FieldDescriptor **)((long)&prefix.field_2 + 8));
          }
          pFVar14 = (FieldDescriptor *)0x0;
          if (*(int *)(pFVar9 + 0x38) == 10) {
            pFVar14 = pFVar9;
          }
        }
        if (local_b8 != (undefined1  [8])psVar19) {
          operator_delete((void *)local_b8);
        }
      }
      if (pFVar14 == (FieldDescriptor *)0x0) {
LAB_002fbafb:
        pFVar14 = (FieldDescriptor *)0x0;
      }
      else {
        if (*(once_flag **)(pFVar14 + 0x30) != (once_flag *)0x0) {
          local_b8 = (undefined1  [8])FieldDescriptor::TypeOnceInit;
          local_80 = (undefined1  [8])pFVar14;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(pFVar14 + 0x30),(_func_void_FieldDescriptor_ptr **)local_b8,
                     (FieldDescriptor **)local_80);
        }
        if (*(int *)(pFVar14 + 0x38) == 10) {
          pDVar12 = FieldDescriptor::message_type(pFVar14);
          pcVar18 = (pointer)(*(undefined8 **)pDVar12)[1];
          if (pcVar18 != field_name._M_dataplus._M_p) goto LAB_002fbafb;
          if (pcVar18 != (pointer)0x0) {
            iVar6 = bcmp((void *)**(undefined8 **)pDVar12,(void *)local_100,(size_t)pcVar18);
            if (iVar6 != 0) {
              pFVar14 = (FieldDescriptor *)0x0;
            }
          }
        }
      }
      if (pFVar14 == (FieldDescriptor *)0x0) {
        if (this->allow_case_insensitive_field_ == true) {
          local_b8 = (undefined1  [8])psVar19;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_b8,local_100,field_name._M_dataplus._M_p + (long)local_100);
          if (full_type_name._M_dataplus._M_p != (pointer)0x0) {
            pcVar18 = (pointer)0x0;
            do {
              if ((byte)(*(byte *)((long)local_b8 + (long)pcVar18) + 0xbf) < 0x1a) {
                *(byte *)((long)local_b8 + (long)pcVar18) =
                     *(byte *)((long)local_b8 + (long)pcVar18) | 0x20;
              }
              pcVar18 = pcVar18 + 1;
            } while (full_type_name._M_dataplus._M_p != pcVar18);
          }
          pFVar14 = Descriptor::FindFieldByLowercaseName(pDVar10,(string *)local_b8);
          if (local_b8 != (undefined1  [8])psVar19) {
            operator_delete((void *)local_b8);
          }
        }
        else {
          pFVar14 = (FieldDescriptor *)0x0;
        }
      }
      __n._M_p = field_name._M_dataplus._M_p;
      if (pFVar14 != (FieldDescriptor *)0x0) goto LAB_002fbdd2;
      uVar21 = (ulong)*(int *)(pDVar10 + 0x88);
      bVar5 = 0 < (long)uVar21;
      if ((long)uVar21 < 1) goto LAB_002fbc5b;
      lVar3 = *(long *)(pDVar10 + 0x60);
      local_148 = (size_type *)local_100;
      lVar20 = -uVar21;
      bVar5 = true;
      uVar22 = 1;
      local_140 = lVar20;
      any_value_field = (FieldDescriptor *)this;
      do {
        puVar15 = *(undefined8 **)(lVar3 + -8 + uVar22 * 8);
        if ((__n._M_p == (pointer)puVar15[1]) &&
           ((__n._M_p == (pointer)0x0 ||
            (iVar6 = bcmp(local_148,(void *)*puVar15,(size_t)__n._M_p), lVar20 = local_140,
            iVar6 == 0)))) break;
        bVar5 = uVar22 < uVar21;
        lVar1 = lVar20 + uVar22;
        uVar22 = uVar22 + 1;
      } while (lVar1 != 0);
      pFVar14 = (FieldDescriptor *)0x0;
      this = (ParserImpl *)any_value_field;
    }
LAB_002fbdd5:
    psVar19 = &full_type_name._M_string_length;
    if (pFVar14 == (FieldDescriptor *)0x0 && !bVar5) {
      if (this->allow_unknown_field_ != false) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&field_name.field_2 + 8),"Message type \"",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (pDVar10 + 8));
        plVar11 = (long *)std::__cxx11::string::append(field_name.field_2._M_local_buf + 8);
        psVar17 = (size_type *)(plVar11 + 2);
        if ((size_type *)*plVar11 == psVar17) {
          serialized_value._M_string_length = *psVar17;
          serialized_value.field_2._M_allocated_capacity = plVar11[3];
          prefix.field_2._8_8_ = &serialized_value._M_string_length;
        }
        else {
          serialized_value._M_string_length = *psVar17;
          prefix.field_2._8_8_ = (size_type *)*plVar11;
        }
        serialized_value._M_dataplus._M_p = (pointer)plVar11[1];
        *plVar11 = (long)psVar17;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&prefix.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_100);
        plVar11 = (long *)std::__cxx11::string::append(local_80);
        psVar17 = (size_type *)(plVar11 + 2);
        if ((size_type *)*plVar11 == psVar17) {
          full_type_name._M_string_length = *psVar17;
          full_type_name.field_2._M_allocated_capacity = plVar11[3];
          local_b8 = (undefined1  [8])psVar19;
        }
        else {
          full_type_name._M_string_length = *psVar17;
          local_b8 = (undefined1  [8])*plVar11;
        }
        full_type_name._M_dataplus._M_p = (pointer)plVar11[1];
        *plVar11 = (long)psVar17;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      (string *)local_b8);
        if (local_b8 != (undefined1  [8])psVar19) {
          operator_delete((void *)local_b8);
        }
        if (local_80 != (undefined1  [8])&prefix._M_string_length) {
          operator_delete((void *)local_80);
        }
        if ((size_type *)prefix.field_2._8_8_ != &serialized_value._M_string_length) {
          operator_delete((void *)prefix.field_2._8_8_);
        }
        if ((undefined8 *)field_name.field_2._8_8_ != &stack0xffffffffffffff30) {
          operator_delete((void *)field_name.field_2._8_8_);
        }
        goto LAB_002fbfe6;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_name.field_2 + 8),"Message type \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (pDVar10 + 8));
      plVar11 = (long *)std::__cxx11::string::append(field_name.field_2._M_local_buf + 8);
      prefix.field_2._8_8_ = &serialized_value._M_string_length;
      psVar17 = (size_type *)(plVar11 + 2);
      if ((size_type *)*plVar11 == psVar17) {
        serialized_value._M_string_length = *psVar17;
        serialized_value.field_2._M_allocated_capacity = plVar11[3];
      }
      else {
        serialized_value._M_string_length = *psVar17;
        prefix.field_2._8_8_ = (size_type *)*plVar11;
      }
      serialized_value._M_dataplus._M_p = (pointer)plVar11[1];
      *plVar11 = (long)psVar17;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&prefix.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100)
      ;
      plVar11 = (long *)std::__cxx11::string::append(local_80);
      psVar17 = (size_type *)(plVar11 + 2);
      if ((size_type *)*plVar11 == psVar17) {
        full_type_name._M_string_length = *psVar17;
        full_type_name.field_2._M_allocated_capacity = plVar11[3];
        local_b8 = (undefined1  [8])psVar19;
      }
      else {
        full_type_name._M_string_length = *psVar17;
        local_b8 = (undefined1  [8])*plVar11;
      }
      full_type_name._M_dataplus._M_p = (pointer)plVar11[1];
      *plVar11 = (long)psVar17;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                  (string *)local_b8);
LAB_002fc417:
      if (local_b8 != (undefined1  [8])&full_type_name._M_string_length) {
        operator_delete((void *)local_b8);
      }
      if (local_80 != (undefined1  [8])&prefix._M_string_length) {
        operator_delete((void *)local_80);
      }
      if ((size_type *)prefix.field_2._8_8_ != &serialized_value._M_string_length) {
        operator_delete((void *)prefix.field_2._8_8_);
      }
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&stack0xffffffffffffff30;
      goto LAB_002fc60f;
    }
LAB_002fbfe6:
    psVar19 = &full_type_name._M_string_length;
    if (pFVar14 != (FieldDescriptor *)0x0) {
      if (this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
        if ((*(int *)(pFVar14 + 0x3c) == 3) ||
           (bVar5 = Reflection::HasField(local_c0,(Message *)serialized_value.field_2._8_8_,pFVar14)
           , !bVar5)) {
          oneof_descriptor = *(OneofDescriptor **)(pFVar14 + 0x58);
          if ((oneof_descriptor == (OneofDescriptor *)0x0) ||
             (bVar5 = Reflection::HasOneof
                                (local_c0,(Message *)serialized_value.field_2._8_8_,oneof_descriptor
                                ), !bVar5)) goto LAB_002fc293;
          pFVar14 = Reflection::GetOneofFieldDescriptor
                              (local_c0,(Message *)serialized_value.field_2._8_8_,oneof_descriptor);
          std::operator+(&local_178,"Field \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100);
          puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
          paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar15 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar15 == paVar16) {
            local_110._M_allocated_capacity = paVar16->_M_allocated_capacity;
            local_110._8_8_ = puVar15[3];
            local_120 = (undefined1  [8])&local_110;
          }
          else {
            local_110._M_allocated_capacity = paVar16->_M_allocated_capacity;
            local_120 = (undefined1  [8])*puVar15;
          }
          _field_number = puVar15[1];
          *puVar15 = paVar16;
          puVar15[1] = 0;
          *(undefined1 *)(puVar15 + 2) = 0;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_name.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_120,
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          pFVar14);
          plVar11 = (long *)std::__cxx11::string::append(field_name.field_2._M_local_buf + 8);
          psVar17 = (size_type *)(plVar11 + 2);
          if ((size_type *)*plVar11 == psVar17) {
            serialized_value._M_string_length = *psVar17;
            serialized_value.field_2._M_allocated_capacity = plVar11[3];
            prefix.field_2._8_8_ = &serialized_value._M_string_length;
          }
          else {
            serialized_value._M_string_length = *psVar17;
            prefix.field_2._8_8_ = (size_type *)*plVar11;
          }
          serialized_value._M_dataplus._M_p = (pointer)plVar11[1];
          *plVar11 = (long)psVar17;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&prefix.field_2 + 8),
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          oneof_descriptor);
          plVar11 = (long *)std::__cxx11::string::append(local_80);
          psVar17 = (size_type *)(plVar11 + 2);
          if ((size_type *)*plVar11 == psVar17) {
            full_type_name._M_string_length = *psVar17;
            full_type_name.field_2._M_allocated_capacity = plVar11[3];
            local_b8 = (undefined1  [8])psVar19;
          }
          else {
            full_type_name._M_string_length = *psVar17;
            local_b8 = (undefined1  [8])*plVar11;
          }
          full_type_name._M_dataplus._M_p = (pointer)plVar11[1];
          *plVar11 = (long)psVar17;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      (string *)local_b8);
          if (local_b8 != (undefined1  [8])psVar19) {
            operator_delete((void *)local_b8);
          }
          if (local_80 != (undefined1  [8])&prefix._M_string_length) {
            operator_delete((void *)local_80);
          }
          if ((size_type *)prefix.field_2._8_8_ != &serialized_value._M_string_length) {
            operator_delete((void *)prefix.field_2._8_8_);
          }
          if ((undefined8 *)field_name.field_2._8_8_ != &stack0xffffffffffffff30) {
            operator_delete((void *)field_name.field_2._8_8_);
          }
          if (local_120 != (undefined1  [8])&local_110) {
            operator_delete((void *)local_120);
          }
          paVar16 = &local_178.field_2;
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_80,"Non-repeated field \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100);
          plVar11 = (long *)std::__cxx11::string::append(local_80);
          psVar17 = (size_type *)(plVar11 + 2);
          if ((size_type *)*plVar11 == psVar17) {
            full_type_name._M_string_length = *psVar17;
            full_type_name.field_2._M_allocated_capacity = plVar11[3];
            local_b8 = (undefined1  [8])psVar19;
          }
          else {
            full_type_name._M_string_length = *psVar17;
            local_b8 = (undefined1  [8])*plVar11;
          }
          full_type_name._M_dataplus._M_p = (pointer)plVar11[1];
          *plVar11 = (long)psVar17;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      (string *)local_b8);
          if (local_b8 != (undefined1  [8])psVar19) {
            operator_delete((void *)local_b8);
          }
          paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&prefix._M_string_length;
        }
LAB_002fc60f:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(&paVar16->_M_allocated_capacity)[-2] != paVar16) {
          operator_delete((undefined1 *)(&paVar16->_M_allocated_capacity)[-2]);
        }
LAB_002fc9df:
        bVar23 = false;
      }
      else {
LAB_002fc293:
        if (*(once_flag **)(pFVar14 + 0x30) != (once_flag *)0x0) {
          local_b8 = (undefined1  [8])FieldDescriptor::TypeOnceInit;
          local_80 = (undefined1  [8])pFVar14;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(pFVar14 + 0x30),(_func_void_FieldDescriptor_ptr **)local_b8,
                     (FieldDescriptor **)local_80);
        }
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(pFVar14 + 0x38) * 4) ==
            10) {
          local_b8 = (undefined1  [8])psVar19;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,":","");
          bVar5 = TryConsume(this,(string *)local_b8);
          if (local_b8 != (undefined1  [8])psVar19) {
            operator_delete((void *)local_b8);
          }
          iVar6 = 0;
          if (((bVar5) && (iVar6 = 0, *(char *)(*(long *)(pFVar14 + 0x78) + 0x4f) == '\x01')) &&
             ((this->tokenizer_).current_.type == TYPE_STRING)) {
            full_type_name._M_dataplus._M_p = (pointer)0x0;
            full_type_name._M_string_length = full_type_name._M_string_length & 0xffffffffffffff00;
            local_b8 = (undefined1  [8])psVar19;
            bVar5 = ConsumeString(this,(string *)local_b8);
            iVar6 = 1;
            if (bVar5) {
              pFVar2 = this->finder_;
              if (pFVar2 == (Finder *)0x0) {
                factory = (MessageFactory *)0x0;
              }
              else {
                iVar6 = (*pFVar2->_vptr_Finder[5])(pFVar2,pFVar14);
                factory = (MessageFactory *)CONCAT44(extraout_var_03,iVar6);
              }
              this_00 = &Reflection::MutableMessage
                                   (local_c0,(Message *)serialized_value.field_2._8_8_,pFVar14,
                                    factory)->super_MessageLite;
              iVar6 = 2;
              MessageLite::ParseFromString(this_00,(string *)local_b8);
            }
            if (local_b8 != (undefined1  [8])psVar19) {
              operator_delete((void *)local_b8);
            }
          }
          if (iVar6 == 0) goto LAB_002fc717;
          if (iVar6 != 2) goto LAB_002fc9df;
        }
        else {
          local_b8 = (undefined1  [8])psVar19;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,":","");
          bVar5 = Consume(this,(string *)local_b8);
          if (local_b8 != (undefined1  [8])psVar19) {
            operator_delete((void *)local_b8);
          }
          if (!bVar5) goto LAB_002fc9df;
LAB_002fc717:
          if (*(int *)(pFVar14 + 0x3c) == 3) {
            local_b8 = (undefined1  [8])psVar19;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"[","");
            bVar5 = TryConsume(this,(string *)local_b8);
            if (local_b8 != (undefined1  [8])psVar19) {
              operator_delete((void *)local_b8);
            }
          }
          else {
            bVar5 = false;
          }
          if (bVar5 == false) {
            CVar7 = FieldDescriptor::cpp_type(pFVar14);
            if (CVar7 == CPPTYPE_MESSAGE) {
              bVar5 = ConsumeFieldMessage(this,(Message *)serialized_value.field_2._8_8_,local_c0,
                                          pFVar14);
            }
            else {
              bVar5 = ConsumeFieldValue(this,(Message *)serialized_value.field_2._8_8_,local_c0,
                                        pFVar14);
            }
            if (bVar5 == false) goto LAB_002fc9df;
          }
          else {
            psVar19 = &prefix._M_string_length;
            local_80 = (undefined1  [8])psVar19;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"]","");
            bVar5 = TryConsume(this,(string *)local_80);
            if (local_80 != (undefined1  [8])psVar19) {
              operator_delete((void *)local_80);
            }
            if (!bVar5) {
              do {
                if (*(once_flag **)(pFVar14 + 0x30) != (once_flag *)0x0) {
                  local_80 = (undefined1  [8])FieldDescriptor::TypeOnceInit;
                  prefix.field_2._8_8_ = pFVar14;
                  std::
                  call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                            (*(once_flag **)(pFVar14 + 0x30),
                             (_func_void_FieldDescriptor_ptr **)local_80,
                             (FieldDescriptor **)((long)&prefix.field_2 + 8));
                }
                if (*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                            (ulong)*(uint *)(pFVar14 + 0x38) * 4) == 10) {
                  bVar5 = ConsumeFieldMessage(this,(Message *)serialized_value.field_2._8_8_,
                                              local_c0,pFVar14);
                }
                else {
                  bVar5 = ConsumeFieldValue(this,(Message *)serialized_value.field_2._8_8_,local_c0,
                                            pFVar14);
                }
                if (bVar5 == false) goto LAB_002fc9df;
                local_80 = (undefined1  [8])psVar19;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"]","");
                bVar5 = TryConsume(this,(string *)local_80);
                if (local_80 != (undefined1  [8])psVar19) {
                  operator_delete((void *)local_80);
                }
                if (bVar5) goto LAB_002fc901;
                local_80 = (undefined1  [8])psVar19;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_80,",","");
                bVar5 = Consume(this,(string *)local_80);
                if (local_80 != (undefined1  [8])psVar19) {
                  operator_delete((void *)local_80);
                }
                bVar23 = false;
              } while (bVar5);
              goto LAB_002fc9e2;
            }
          }
        }
LAB_002fc901:
        psVar19 = &prefix._M_string_length;
        local_80 = (undefined1  [8])psVar19;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_80,";","");
        bVar5 = TryConsume(this,(string *)local_80);
        if (!bVar5) {
          prefix.field_2._8_8_ = &serialized_value._M_string_length;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)((long)&prefix.field_2 + 8),",","");
          TryConsume(this,(string *)((long)&prefix.field_2 + 8));
          if ((!bVar5) && ((size_type *)prefix.field_2._8_8_ != &serialized_value._M_string_length))
          {
            operator_delete((void *)prefix.field_2._8_8_);
          }
        }
        if (local_80 != (undefined1  [8])psVar19) {
          operator_delete((void *)local_80);
        }
        if (*(char *)(*(long *)(pFVar14 + 0x78) + 0x4e) == '\x01') {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_name.field_2 + 8),"text format contains deprecated field \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100);
          plVar11 = (long *)std::__cxx11::string::append(field_name.field_2._M_local_buf + 8);
          pFVar9 = (FieldDescriptor *)(plVar11 + 2);
          if ((FieldDescriptor *)*plVar11 == pFVar9) {
            prefix._M_string_length = *(size_type *)pFVar9;
            prefix.field_2._M_allocated_capacity = plVar11[3];
            local_80 = (undefined1  [8])psVar19;
          }
          else {
            prefix._M_string_length = *(size_type *)pFVar9;
            local_80 = (undefined1  [8])*plVar11;
          }
          prefix._M_dataplus._M_p = (pointer)plVar11[1];
          *plVar11 = (long)pFVar9;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        (string *)local_80);
          if (local_80 != (undefined1  [8])psVar19) {
            operator_delete((void *)local_80);
          }
          if ((undefined8 *)field_name.field_2._8_8_ != &stack0xffffffffffffff30) {
            operator_delete((void *)field_name.field_2._8_8_);
          }
        }
        bVar23 = true;
        if (this->parse_info_tree_ != (ParseInfoTree *)0x0) {
          ParseInfoTree::RecordLocation
                    (this->parse_info_tree_,pFVar14,(ParseLocation)((local_158 << 0x20) + local_150)
                    );
        }
      }
      goto LAB_002fc9e2;
    }
    if (((this->allow_unknown_extension_ | this->allow_unknown_field_) & 1U) == 0 && !bVar5) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_b8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/text_format.cc"
                 ,0x1fb);
      other = internal::LogMessage::operator<<
                        ((LogMessage *)local_b8,
                         "CHECK failed: allow_unknown_field_ || allow_unknown_extension_ || reserved_field: "
                        );
      internal::LogFinisher::operator=((LogFinisher *)local_80,other);
      internal::LogMessage::~LogMessage((LogMessage *)local_b8);
    }
    local_b8 = (undefined1  [8])psVar19;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,":","");
    bVar5 = TryConsume(this,(string *)local_b8);
    if (bVar5) {
      local_80 = (undefined1  [8])&prefix._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"{","");
      pcVar18 = (pointer)(this->tokenizer_).current_.text._M_string_length;
      if ((pcVar18 == prefix._M_dataplus._M_p) &&
         ((pcVar18 == (pointer)0x0 ||
          (iVar6 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,(void *)local_80,
                        (size_t)pcVar18), iVar6 == 0)))) goto LAB_002fc19c;
      prefix.field_2._8_8_ = &serialized_value._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)((long)&prefix.field_2 + 8),"<","");
      pcVar18 = (pointer)(this->tokenizer_).current_.text._M_string_length;
      bVar4 = true;
      if (pcVar18 == serialized_value._M_dataplus._M_p) {
        bVar23 = true;
        if (pcVar18 != (pointer)0x0) {
          iVar6 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,
                       (void *)prefix.field_2._8_8_,(size_t)pcVar18);
          bVar23 = iVar6 != 0;
          goto LAB_002fc1a2;
        }
        goto LAB_002fc19f;
      }
      bVar23 = true;
    }
    else {
LAB_002fc19c:
      bVar23 = false;
LAB_002fc19f:
      bVar4 = bVar23;
      bVar23 = false;
    }
LAB_002fc1a2:
    if ((bVar4) && ((size_type *)prefix.field_2._8_8_ != &serialized_value._M_string_length)) {
      operator_delete((void *)prefix.field_2._8_8_);
    }
    if ((bVar5) && (local_80 != (undefined1  [8])&prefix._M_string_length)) {
      operator_delete((void *)local_80);
    }
    if (local_b8 != (undefined1  [8])psVar19) {
      operator_delete((void *)local_b8);
    }
    if (bVar23) {
      bVar23 = SkipFieldValue(this);
    }
    else {
      bVar23 = SkipFieldMessage(this);
    }
    goto LAB_002fc9e2;
  }
  full_type_name._M_dataplus._M_p = (pointer)0x0;
  full_type_name._M_string_length = full_type_name._M_string_length & 0xffffffffffffff00;
  prefix._M_dataplus._M_p = (pointer)0x0;
  prefix._M_string_length = prefix._M_string_length & 0xffffffffffffff00;
  local_b8 = (undefined1  [8])&full_type_name._M_string_length;
  local_80 = (undefined1  [8])&prefix._M_string_length;
  bVar5 = ConsumeAnyTypeUrl(this,(string *)local_b8,(string *)local_80);
  if (bVar5) {
    prefix.field_2._8_8_ = &serialized_value._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)((long)&prefix.field_2 + 8),"]","");
    bVar5 = Consume(this,(string *)((long)&prefix.field_2 + 8));
    if ((size_type *)prefix.field_2._8_8_ != &serialized_value._M_string_length) {
      operator_delete((void *)prefix.field_2._8_8_);
    }
    if (!bVar5) goto LAB_002fb5a6;
    prefix.field_2._8_8_ = &serialized_value._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)((long)&prefix.field_2 + 8),":","");
    TryConsume(this,(string *)((long)&prefix.field_2 + 8));
    if ((size_type *)prefix.field_2._8_8_ != &serialized_value._M_string_length) {
      operator_delete((void *)prefix.field_2._8_8_);
    }
    prefix.field_2._8_8_ = &serialized_value._M_string_length;
    serialized_value._M_dataplus._M_p = (pointer)0x0;
    serialized_value._M_string_length = serialized_value._M_string_length & 0xffffffffffffff00;
    pFVar2 = this->finder_;
    if (pFVar2 == (Finder *)0x0) {
      pDVar10 = anon_unknown_20::DefaultFinderFindAnyType
                          ((Message *)serialized_value.field_2._8_8_,(string *)local_80,
                           (string *)local_b8);
    }
    else {
      iVar6 = (*pFVar2->_vptr_Finder[4])(pFVar2,serialized_value.field_2._8_8_,local_80,local_b8);
      pDVar10 = (Descriptor *)CONCAT44(extraout_var_00,iVar6);
    }
    if (pDVar10 == (Descriptor *)0x0) {
      std::operator+(&local_178,"Could not find type \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
      plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_b8);
      local_120 = (undefined1  [8])&local_110;
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 == paVar16) {
        local_110._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_110._8_8_ = plVar11[3];
      }
      else {
        local_110._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_120 = (undefined1  [8])*plVar11;
      }
      _field_number = plVar11[1];
      *plVar11 = (long)paVar16;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append(local_120);
      psVar19 = (size_type *)(plVar11 + 2);
      if ((size_type *)*plVar11 == psVar19) {
        local_d0 = *psVar19;
        uStack_c8 = plVar11[3];
        field_name.field_2._8_8_ = &stack0xffffffffffffff30;
      }
      else {
        local_d0 = *psVar19;
        field_name.field_2._8_8_ = (size_type *)*plVar11;
      }
      *plVar11 = (long)psVar19;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                  (string *)((long)&field_name.field_2 + 8));
      if ((undefined8 *)field_name.field_2._8_8_ != &stack0xffffffffffffff30) {
        operator_delete((void *)field_name.field_2._8_8_);
      }
      if (local_120 != (undefined1  [8])&local_110) {
        operator_delete((void *)local_120);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
LAB_002fba58:
        operator_delete(local_178._M_dataplus._M_p);
      }
LAB_002fba5d:
      bVar23 = false;
    }
    else {
      bVar5 = ConsumeAnyValue(this,pDVar10,(string *)((long)&prefix.field_2 + 8));
      if (!bVar5) goto LAB_002fba5d;
      if ((this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) &&
         (((*(int *)(local_138 + 0x3c) != 3 &&
           (bVar5 = Reflection::HasField
                              (local_c0,(Message *)serialized_value.field_2._8_8_,local_138), bVar5)
           ) || ((*(int *)(any_type_url_field + 0x3c) != 3 &&
                 (bVar5 = Reflection::HasField
                                    (local_c0,(Message *)serialized_value.field_2._8_8_,
                                     any_type_url_field), bVar5)))))) {
        field_name.field_2._8_8_ = &stack0xffffffffffffff30;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)((long)&field_name.field_2 + 8),
                   "Non-repeated Any specified multiple times.","");
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    (string *)((long)&field_name.field_2 + 8));
        local_178._M_dataplus._M_p = (pointer)field_name.field_2._8_8_;
        if ((undefined8 *)field_name.field_2._8_8_ != &stack0xffffffffffffff30) goto LAB_002fba58;
        goto LAB_002fba5d;
      }
      std::operator+(&local_1d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
      Reflection::SetString(local_c0,(Message *)serialized_value.field_2._8_8_,local_138,&local_1d8)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_198,prefix.field_2._8_8_,
                 serialized_value._M_dataplus._M_p + prefix.field_2._8_8_);
      Reflection::SetString
                (local_c0,(Message *)serialized_value.field_2._8_8_,any_type_url_field,&local_198);
      bVar23 = true;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p);
      }
    }
    if ((size_type *)prefix.field_2._8_8_ != &serialized_value._M_string_length) {
      operator_delete((void *)prefix.field_2._8_8_);
    }
  }
  else {
LAB_002fb5a6:
    bVar23 = false;
  }
  if (local_80 != (undefined1  [8])&prefix._M_string_length) {
    operator_delete((void *)local_80);
  }
  if (local_b8 != (undefined1  [8])&full_type_name._M_string_length) {
    operator_delete((void *)local_b8);
  }
LAB_002fc9e2:
  if (local_100 != (undefined1  [8])&field_name._M_string_length) {
    operator_delete((void *)local_100);
  }
  return bVar23;
}

Assistant:

bool ConsumeField(Message* message) {
    const Reflection* reflection = message->GetReflection();
    const Descriptor* descriptor = message->GetDescriptor();

    std::string field_name;
    bool reserved_field = false;
    const FieldDescriptor* field = nullptr;
    int start_line = tokenizer_.current().line;
    int start_column = tokenizer_.current().column;

    const FieldDescriptor* any_type_url_field;
    const FieldDescriptor* any_value_field;
    if (internal::GetAnyFieldDescriptors(*message, &any_type_url_field,
                                         &any_value_field) &&
        TryConsume("[")) {
      std::string full_type_name, prefix;
      DO(ConsumeAnyTypeUrl(&full_type_name, &prefix));
      DO(Consume("]"));
      TryConsume(":");  // ':' is optional between message labels and values.
      std::string serialized_value;
      const Descriptor* value_descriptor =
          finder_ ? finder_->FindAnyType(*message, prefix, full_type_name)
                  : DefaultFinderFindAnyType(*message, prefix, full_type_name);
      if (value_descriptor == nullptr) {
        ReportError("Could not find type \"" + prefix + full_type_name +
                    "\" stored in google.protobuf.Any.");
        return false;
      }
      DO(ConsumeAnyValue(value_descriptor, &serialized_value));
      if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
        // Fail if any_type_url_field has already been specified.
        if ((!any_type_url_field->is_repeated() &&
             reflection->HasField(*message, any_type_url_field)) ||
            (!any_value_field->is_repeated() &&
             reflection->HasField(*message, any_value_field))) {
          ReportError("Non-repeated Any specified multiple times.");
          return false;
        }
      }
      reflection->SetString(message, any_type_url_field,
                            std::string(prefix + full_type_name));
      reflection->SetString(message, any_value_field, serialized_value);
      return true;
    }
    if (TryConsume("[")) {
      // Extension.
      DO(ConsumeFullTypeName(&field_name));
      DO(Consume("]"));

      field = finder_ ? finder_->FindExtension(message, field_name)
                      : DefaultFinderFindExtension(message, field_name);

      if (field == nullptr) {
        if (!allow_unknown_field_ && !allow_unknown_extension_) {
          ReportError("Extension \"" + field_name +
                      "\" is not defined or "
                      "is not an extension of \"" +
                      descriptor->full_name() + "\".");
          return false;
        } else {
          ReportWarning("Ignoring extension \"" + field_name +
                        "\" which is not defined or is not an extension of \"" +
                        descriptor->full_name() + "\".");
        }
      }
    } else {
      DO(ConsumeIdentifier(&field_name));

      int32 field_number;
      if (allow_field_number_ &&
          safe_strto32(field_name, &field_number)) {
        if (descriptor->IsExtensionNumber(field_number)) {
          field = finder_
                      ? finder_->FindExtensionByNumber(descriptor, field_number)
                      : DefaultFinderFindExtensionByNumber(descriptor,
                                                           field_number);
        } else if (descriptor->IsReservedNumber(field_number)) {
          reserved_field = true;
        } else {
          field = descriptor->FindFieldByNumber(field_number);
        }
      } else {
        field = descriptor->FindFieldByName(field_name);
        // Group names are expected to be capitalized as they appear in the
        // .proto file, which actually matches their type names, not their
        // field names.
        if (field == nullptr) {
          std::string lower_field_name = field_name;
          LowerString(&lower_field_name);
          field = descriptor->FindFieldByName(lower_field_name);
          // If the case-insensitive match worked but the field is NOT a group,
          if (field != nullptr &&
              field->type() != FieldDescriptor::TYPE_GROUP) {
            field = nullptr;
          }
        }
        // Again, special-case group names as described above.
        if (field != nullptr && field->type() == FieldDescriptor::TYPE_GROUP &&
            field->message_type()->name() != field_name) {
          field = nullptr;
        }

        if (field == nullptr && allow_case_insensitive_field_) {
          std::string lower_field_name = field_name;
          LowerString(&lower_field_name);
          field = descriptor->FindFieldByLowercaseName(lower_field_name);
        }

        if (field == nullptr) {
          reserved_field = descriptor->IsReservedName(field_name);
        }
      }

      if (field == nullptr && !reserved_field) {
        if (!allow_unknown_field_) {
          ReportError("Message type \"" + descriptor->full_name() +
                      "\" has no field named \"" + field_name + "\".");
          return false;
        } else {
          ReportWarning("Message type \"" + descriptor->full_name() +
                        "\" has no field named \"" + field_name + "\".");
        }
      }
    }

    // Skips unknown or reserved fields.
    if (field == nullptr) {
      GOOGLE_CHECK(allow_unknown_field_ || allow_unknown_extension_ || reserved_field);

      // Try to guess the type of this field.
      // If this field is not a message, there should be a ":" between the
      // field name and the field value and also the field value should not
      // start with "{" or "<" which indicates the beginning of a message body.
      // If there is no ":" or there is a "{" or "<" after ":", this field has
      // to be a message or the input is ill-formed.
      if (TryConsume(":") && !LookingAt("{") && !LookingAt("<")) {
        return SkipFieldValue();
      } else {
        return SkipFieldMessage();
      }
    }

    if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      // Fail if the field is not repeated and it has already been specified.
      if (!field->is_repeated() && reflection->HasField(*message, field)) {
        ReportError("Non-repeated field \"" + field_name +
                    "\" is specified multiple times.");
        return false;
      }
      // Fail if the field is a member of a oneof and another member has already
      // been specified.
      const OneofDescriptor* oneof = field->containing_oneof();
      if (oneof != nullptr && reflection->HasOneof(*message, oneof)) {
        const FieldDescriptor* other_field =
            reflection->GetOneofFieldDescriptor(*message, oneof);
        ReportError("Field \"" + field_name +
                    "\" is specified along with "
                    "field \"" +
                    other_field->name() +
                    "\", another member "
                    "of oneof \"" +
                    oneof->name() + "\".");
        return false;
      }
    }

    // Perform special handling for embedded message types.
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // ':' is optional here.
      bool consumed_semicolon = TryConsume(":");
      if (consumed_semicolon && field->options().weak() &&
          LookingAtType(io::Tokenizer::TYPE_STRING)) {
        // we are getting a bytes string for a weak field.
        std::string tmp;
        DO(ConsumeString(&tmp));
        MessageFactory* factory =
            finder_ ? finder_->FindExtensionFactory(field) : nullptr;
        reflection->MutableMessage(message, field, factory)
            ->ParseFromString(tmp);
        goto label_skip_parsing;
      }
    } else {
      // ':' is required here.
      DO(Consume(":"));
    }

    if (field->is_repeated() && TryConsume("[")) {
      // Short repeated format, e.g.  "foo: [1, 2, 3]".
      if (!TryConsume("]")) {
        // "foo: []" is treated as empty.
        while (true) {
          if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            // Perform special handling for embedded message types.
            DO(ConsumeFieldMessage(message, reflection, field));
          } else {
            DO(ConsumeFieldValue(message, reflection, field));
          }
          if (TryConsume("]")) {
            break;
          }
          DO(Consume(","));
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      DO(ConsumeFieldMessage(message, reflection, field));
    } else {
      DO(ConsumeFieldValue(message, reflection, field));
    }
  label_skip_parsing:
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");

    if (field->options().deprecated()) {
      ReportWarning("text format contains deprecated field \"" + field_name +
                    "\"");
    }

    // If a parse info tree exists, add the location for the parsed
    // field.
    if (parse_info_tree_ != nullptr) {
      RecordLocation(parse_info_tree_, field,
                     ParseLocation(start_line, start_column));
    }

    return true;
  }